

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O2

int * inform_black_box_parts
                (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,int *box,
                inform_error *err)

{
  size_t __size;
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  size_t i_1;
  long *plVar6;
  int *__ptr;
  size_t sVar7;
  size_t sVar8;
  int *b_00;
  int *piVar9;
  int iVar10;
  long lVar11;
  size_t sVar12;
  size_t i;
  ulong uVar13;
  size_t l_00;
  
  uVar13 = 1;
  _Var5 = check_arguments(series,l,1,n,b,(size_t *)0x0,(size_t *)0x0,err);
  if (_Var5) {
    return (int *)0x0;
  }
  if (parts != (size_t *)0x0 && nparts != 0) {
    __size = l * 8;
    plVar6 = (long *)malloc(__size);
    memcpy(plVar6,parts,__size);
    qsort(plVar6,l,8,compare_ints);
    if (*plVar6 == 0) {
      do {
        if (l <= uVar13) {
          lVar3 = plVar6[l - 1];
          free(plVar6);
          if (lVar3 + 1U != nparts) goto LAB_00138c97;
          lVar3 = n * 4 + 4;
          __ptr = box;
          if ((box == (int *)0x0) && (__ptr = (int *)malloc(lVar3 * nparts), __ptr == (int *)0x0))
          goto LAB_00138f0d;
          lVar11 = nparts * n;
          if (nparts == l) {
            memcpy(__ptr,series,lVar11 * 4);
            for (sVar7 = 0; nparts != sVar7; sVar7 = sVar7 + 1) {
              __ptr[lVar11 + sVar7] = b[sVar7];
            }
            return __ptr;
          }
          plVar6 = (long *)malloc(__size);
          if (plVar6 == (long *)0x0) goto joined_r0x00138f01;
          for (sVar7 = 0; l != sVar7; sVar7 = sVar7 + 1) {
            plVar6[sVar7] = -1;
          }
          sVar7 = 0;
          do {
            if (sVar7 == nparts) {
              free(plVar6);
              return __ptr;
            }
            l_00 = 0;
            for (sVar8 = 0; l != sVar8; sVar8 = sVar8 + 1) {
              if (parts[sVar8] == sVar7) {
                plVar6[l_00] = sVar8;
                l_00 = l_00 + 1;
              }
            }
            if (l_00 == 1) {
              lVar4 = *plVar6;
              memcpy(__ptr + sVar7 * n,series + lVar4 * n,n * 4);
              __ptr[lVar11 + sVar7] = b[lVar4];
            }
            else {
              b_00 = (int *)malloc(lVar3 * l_00);
              if (b_00 == (int *)0x0) {
                free(plVar6);
joined_r0x00138f01:
                if (box == (int *)0x0) {
                  free(__ptr);
                }
LAB_00138f0d:
                if (err == (inform_error *)0x0) {
                  return (int *)0x0;
                }
                *err = INFORM_ENOMEM;
                return (int *)0x0;
              }
              __ptr[lVar11 + sVar7] = 1;
              iVar10 = 1;
              piVar9 = b_00 + l_00;
              for (sVar8 = 0; sVar8 != l_00; sVar8 = sVar8 + 1) {
                lVar4 = plVar6[sVar8];
                iVar2 = b[lVar4];
                b_00[sVar8] = iVar2;
                iVar10 = iVar10 * iVar2;
                __ptr[lVar11 + sVar7] = iVar10;
                for (sVar12 = 0; n != sVar12; sVar12 = sVar12 + 1) {
                  piVar9[sVar12] = series[lVar4 * n + sVar12];
                }
                piVar9 = piVar9 + n;
              }
              inform_black_box(b_00 + l_00,l_00,1,n,b_00,(size_t *)0x0,(size_t *)0x0,
                               __ptr + sVar7 * n,err);
              free(b_00);
              _Var5 = inform_failed(err);
              if (_Var5) {
                free(plVar6);
                if (box != (int *)0x0) {
                  return (int *)0x0;
                }
                free(__ptr);
                return (int *)0x0;
              }
            }
            for (sVar8 = 0; l != sVar8; sVar8 = sVar8 + 1) {
              plVar6[sVar8] = -1;
            }
            sVar7 = sVar7 + 1;
          } while( true );
        }
        plVar1 = plVar6 + uVar13;
        lVar3 = uVar13 - 1;
        uVar13 = uVar13 + 1;
      } while (((int)*plVar1 - (int)plVar6[lVar3] & 0xfffffffeU) == 0);
    }
    free(plVar6);
  }
LAB_00138c97:
  if (err != (inform_error *)0x0) {
    *err = INFORM_EPARTS;
  }
  return (int *)0x0;
}

Assistant:

int *inform_black_box_parts(int const *series, size_t l, size_t n, int const *b,
    size_t const *parts, size_t nparts, int *box, inform_error *err)
{
    if (check_arguments(series, l, 1, n, b, NULL, NULL, err))
    {
        return NULL;
    }
    if (parts == NULL || nparts < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
    }
    else
    {
        size_t *sorted_parts = malloc(l * sizeof(size_t));
        memcpy(sorted_parts, parts, l * sizeof(size_t));
        qsort(sorted_parts, l, sizeof(size_t), compare_ints);
        if (sorted_parts[0] != 0)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        for (size_t i = 1; i < l; ++i)
        {
            int x = (int)(sorted_parts[i] - sorted_parts[i-1]);
            if (x != 0 && x != 1)
            {
                free(sorted_parts);
                INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
            }
        }
        if (sorted_parts[l-1] + 1 != nparts)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        free(sorted_parts);
    }

    int allocate = (box == NULL);
    if (allocate)
    {
        box = malloc(nparts * (1 + n) * sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    int *partitioned = box;
    int *bases = partitioned + nparts * n;
    if (nparts == l)
    {
        memcpy(partitioned, series, l * n * sizeof(int));
        for (size_t i = 0; i < l; ++i) bases[i] = b[i];
    }
    else
    {
        size_t *members = malloc(l * sizeof(size_t));
        if (members == NULL)
        {
            if (allocate) free(box);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) members[i] = -1;

        for (size_t i = 0; i < nparts; ++i)
        {
            size_t k = 0;
            for (size_t j = 0; j < l; ++j)
            {
                if (parts[j] == i)
                {
                    members[k++] = j;
                }
            }

            if (k == 1)
            {
                memcpy(partitioned + n*i, series + n*members[0], n*sizeof(int));
                bases[i] = b[members[0]];
            }
            else
            {
                int *subbases = malloc(k * (1 + n) * sizeof(int));
                int *subseries = subbases + k;
                if (subseries == NULL)
                {
                    free(members);
                    if (allocate) free(box);
                    INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                }
                bases[i] = 1;
                for (size_t j = 0; j < k; ++j)
                {
                    subbases[j] = b[members[j]];
                    bases[i] *= subbases[j];
                    for (size_t p = 0; p < n; ++p)
                    {
                        subseries[p + n*j] = series[p + n*members[j]];
                    }
                }
                inform_black_box(subseries, k, 1, n, subbases, NULL, NULL,
                    partitioned + n*i, err);
                free(subbases);
                if (inform_failed(err))
                {
                    free(members);
                    if (allocate) free(box);
                    return NULL;
                }
            }
            for (size_t i = 0; i < l; ++i) members[i] = -1;
        }
        free(members);
    }
    return box;
}